

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

void objc_registerProtocol(Protocol *proto)

{
  Protocol *pPVar1;
  
  if (proto != (Protocol *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&protocol_table_lock);
    pPVar1 = objc_getProtocol(proto->name);
    if ((pPVar1 == (Protocol *)0x0) &&
       ((objc_class *)proto->isa == &_OBJC_CLASS___IncompleteProtocol)) {
      proto->isa = (id)&_OBJC_CLASS_Protocol;
      protocol_insert(known_protocol_table,proto);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&protocol_table_lock);
    return;
  }
  return;
}

Assistant:

void objc_registerProtocol(Protocol *proto)
{
	if (NULL == proto) { return; }
	LOCK_FOR_SCOPE(&protocol_table_lock);
	if (objc_getProtocol(proto->name) != NULL) { return; }
	if (proto->isa != (id)&_OBJC_CLASS___IncompleteProtocol) { return; }
	proto->isa = (id)&_OBJC_CLASS_Protocol;
	protocol_table_insert(proto);
}